

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

TypeCode * __thiscall
TypeFactory::getTypeCode
          (TypeFactory *this,ProtoModel *model,Datatype *outtype,
          vector<Datatype_*,_std::allocator<Datatype_*>_> *intypes,bool dotdotdot)

{
  Datatype *voidtype;
  TypeCode *pTVar1;
  TypeCode tc;
  allocator local_91;
  string local_90;
  TypeCode local_70;
  
  std::__cxx11::string::string((string *)&local_90,"",&local_91);
  TypeCode::TypeCode(&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  voidtype = &getTypeVoid(this)->super_Datatype;
  TypeCode::set(&local_70,model,outtype,intypes,dotdotdot,voidtype);
  pTVar1 = (TypeCode *)findAdd(this,&local_70.super_Datatype);
  TypeCode::~TypeCode(&local_70);
  return pTVar1;
}

Assistant:

TypeCode *TypeFactory::getTypeCode(ProtoModel *model,Datatype *outtype,
				   const vector<Datatype *> &intypes,
				   bool dotdotdot)
{
  TypeCode tc("");		// getFuncdata type with no name
  tc.set(model,outtype,intypes,dotdotdot,getTypeVoid());
  return (TypeCode *) findAdd(tc);
}